

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# uint256_tests.cpp
# Opt level: O1

void __thiscall uint256_tests::comparison::test_method(comparison *this)

{
  uchar *puVar1;
  long lVar2;
  undefined4 uVar3;
  undefined8 uVar4;
  undefined8 uVar5;
  undefined8 uVar6;
  undefined8 uVar7;
  int iVar8;
  iterator in_R8;
  iterator pvVar9;
  iterator in_R9;
  iterator pvVar10;
  uint uVar11;
  int i;
  long in_FS_OFFSET;
  bool bVar12;
  const_string file;
  const_string file_00;
  const_string file_01;
  const_string file_02;
  const_string file_03;
  const_string file_04;
  const_string file_05;
  const_string file_06;
  const_string file_07;
  const_string file_08;
  const_string file_09;
  const_string file_10;
  const_string file_11;
  const_string file_12;
  const_string file_13;
  const_string file_14;
  const_string file_15;
  const_string file_16;
  const_string msg;
  const_string msg_00;
  const_string msg_01;
  const_string msg_02;
  const_string msg_03;
  const_string msg_04;
  const_string msg_05;
  const_string msg_06;
  const_string msg_07;
  const_string msg_08;
  const_string msg_09;
  const_string msg_10;
  const_string msg_11;
  const_string msg_12;
  const_string msg_13;
  const_string msg_14;
  const_string msg_15;
  const_string msg_16;
  undefined1 *local_390;
  undefined1 *local_388;
  char *local_380;
  char *local_378;
  undefined1 *local_370;
  undefined1 *local_368;
  char *local_360;
  char *local_358;
  undefined1 *local_350;
  undefined1 *local_348;
  char *local_340;
  char *local_338;
  undefined1 *local_330;
  undefined1 *local_328;
  char *local_320;
  char *local_318;
  undefined1 *local_310;
  undefined1 *local_308;
  char *local_300;
  char *local_2f8;
  undefined1 *local_2f0;
  undefined1 *local_2e8;
  char *local_2e0;
  char *local_2d8;
  undefined1 *local_2d0;
  undefined1 *local_2c8;
  char *local_2c0;
  char *local_2b8;
  undefined1 *local_2b0;
  undefined1 *local_2a8;
  char *local_2a0;
  char *local_298;
  undefined1 *local_290;
  undefined1 *local_288;
  char *local_280;
  char *local_278;
  undefined1 *local_270;
  undefined1 *local_268;
  char *local_260;
  char *local_258;
  undefined1 *local_250;
  undefined1 *local_248;
  char *local_240;
  char *local_238;
  undefined1 *local_230;
  undefined1 *local_228;
  char *local_220;
  char *local_218;
  undefined1 *local_210;
  undefined1 *local_208;
  char *local_200;
  char *local_1f8;
  undefined1 *local_1f0;
  undefined1 *local_1e8;
  char *local_1e0;
  char *local_1d8;
  undefined1 *local_1d0;
  undefined1 *local_1c8;
  char *local_1c0;
  char *local_1b8;
  undefined1 *local_1b0;
  undefined1 *local_1a8;
  char *local_1a0;
  char *local_198;
  undefined1 *local_190;
  undefined1 *local_188;
  char *local_180;
  char *local_178;
  undefined1 *local_170;
  undefined1 *local_168;
  char *local_160;
  char *local_158;
  uint160 *local_150;
  undefined **local_148;
  undefined1 local_140;
  undefined1 *local_138;
  uint160 *local_130;
  undefined1 local_128 [8];
  undefined **local_120;
  uchar local_118;
  undefined1 *local_110;
  uint160 *local_108;
  shared_count local_100;
  char *local_f8;
  assertion_result local_f0;
  uint160 TmpS;
  uint160 LastS;
  undefined1 local_98 [9];
  undefined6 uStack_8f;
  undefined1 uStack_89;
  shared_count sStack_88;
  undefined7 local_80;
  undefined1 uStack_79;
  uint256 TmpL;
  uint256 LastL;
  
  lVar2 = *(long *)(in_FS_OFFSET + 0x28);
  LastL.super_base_blob<256U>.m_data._M_elems[0x10] = '\0';
  LastL.super_base_blob<256U>.m_data._M_elems[0x11] = '\0';
  LastL.super_base_blob<256U>.m_data._M_elems[0x12] = '\0';
  LastL.super_base_blob<256U>.m_data._M_elems[0x13] = '\0';
  LastL.super_base_blob<256U>.m_data._M_elems[0x14] = '\0';
  LastL.super_base_blob<256U>.m_data._M_elems[0x15] = '\0';
  LastL.super_base_blob<256U>.m_data._M_elems[0x16] = '\0';
  LastL.super_base_blob<256U>.m_data._M_elems[0x17] = '\0';
  LastL.super_base_blob<256U>.m_data._M_elems[0x18] = '\0';
  LastL.super_base_blob<256U>.m_data._M_elems[0x19] = '\0';
  LastL.super_base_blob<256U>.m_data._M_elems[0x1a] = '\0';
  LastL.super_base_blob<256U>.m_data._M_elems[0x1b] = '\0';
  LastL.super_base_blob<256U>.m_data._M_elems[0x1c] = '\0';
  LastL.super_base_blob<256U>.m_data._M_elems[0x1d] = '\0';
  LastL.super_base_blob<256U>.m_data._M_elems[0x1e] = '\0';
  LastL.super_base_blob<256U>.m_data._M_elems[0x1f] = '\0';
  LastL.super_base_blob<256U>.m_data._M_elems[0] = '\0';
  LastL.super_base_blob<256U>.m_data._M_elems[1] = '\0';
  LastL.super_base_blob<256U>.m_data._M_elems[2] = '\0';
  LastL.super_base_blob<256U>.m_data._M_elems[3] = '\0';
  LastL.super_base_blob<256U>.m_data._M_elems[4] = '\0';
  LastL.super_base_blob<256U>.m_data._M_elems[5] = '\0';
  LastL.super_base_blob<256U>.m_data._M_elems[6] = '\0';
  LastL.super_base_blob<256U>.m_data._M_elems[7] = '\0';
  LastL.super_base_blob<256U>.m_data._M_elems[8] = '\0';
  LastL.super_base_blob<256U>.m_data._M_elems[9] = '\0';
  LastL.super_base_blob<256U>.m_data._M_elems[10] = '\0';
  LastL.super_base_blob<256U>.m_data._M_elems[0xb] = '\0';
  LastL.super_base_blob<256U>.m_data._M_elems[0xc] = '\0';
  LastL.super_base_blob<256U>.m_data._M_elems[0xd] = '\0';
  LastL.super_base_blob<256U>.m_data._M_elems[0xe] = '\0';
  LastL.super_base_blob<256U>.m_data._M_elems[0xf] = '\0';
  uVar11 = 0xff;
  uVar4 = LastL.super_base_blob<256U>.m_data._M_elems._0_8_;
  uVar5 = LastL.super_base_blob<256U>.m_data._M_elems._8_8_;
  uVar6 = LastL.super_base_blob<256U>.m_data._M_elems._16_8_;
  uVar7 = LastL.super_base_blob<256U>.m_data._M_elems._24_8_;
  do {
    LastL.super_base_blob<256U>.m_data._M_elems._24_8_ = uVar7;
    LastL.super_base_blob<256U>.m_data._M_elems._16_8_ = uVar6;
    LastL.super_base_blob<256U>.m_data._M_elems._8_8_ = uVar5;
    LastL.super_base_blob<256U>.m_data._M_elems._0_8_ = uVar4;
    TmpL.super_base_blob<256U>.m_data._M_elems[0x10] = '\0';
    TmpL.super_base_blob<256U>.m_data._M_elems[0x11] = '\0';
    TmpL.super_base_blob<256U>.m_data._M_elems[0x12] = '\0';
    TmpL.super_base_blob<256U>.m_data._M_elems[0x13] = '\0';
    TmpL.super_base_blob<256U>.m_data._M_elems[0x14] = '\0';
    TmpL.super_base_blob<256U>.m_data._M_elems[0x15] = '\0';
    TmpL.super_base_blob<256U>.m_data._M_elems[0x16] = '\0';
    TmpL.super_base_blob<256U>.m_data._M_elems[0x17] = '\0';
    TmpL.super_base_blob<256U>.m_data._M_elems[0x18] = '\0';
    TmpL.super_base_blob<256U>.m_data._M_elems[0x19] = '\0';
    TmpL.super_base_blob<256U>.m_data._M_elems[0x1a] = '\0';
    TmpL.super_base_blob<256U>.m_data._M_elems[0x1b] = '\0';
    TmpL.super_base_blob<256U>.m_data._M_elems[0x1c] = '\0';
    TmpL.super_base_blob<256U>.m_data._M_elems[0x1d] = '\0';
    TmpL.super_base_blob<256U>.m_data._M_elems[0x1e] = '\0';
    TmpL.super_base_blob<256U>.m_data._M_elems[0x1f] = '\0';
    TmpL.super_base_blob<256U>.m_data._M_elems[0] = '\0';
    TmpL.super_base_blob<256U>.m_data._M_elems[1] = '\0';
    TmpL.super_base_blob<256U>.m_data._M_elems[2] = '\0';
    TmpL.super_base_blob<256U>.m_data._M_elems[3] = '\0';
    TmpL.super_base_blob<256U>.m_data._M_elems[4] = '\0';
    TmpL.super_base_blob<256U>.m_data._M_elems[5] = '\0';
    TmpL.super_base_blob<256U>.m_data._M_elems[6] = '\0';
    TmpL.super_base_blob<256U>.m_data._M_elems[7] = '\0';
    TmpL.super_base_blob<256U>.m_data._M_elems[8] = '\0';
    TmpL.super_base_blob<256U>.m_data._M_elems[9] = '\0';
    TmpL.super_base_blob<256U>.m_data._M_elems[10] = '\0';
    TmpL.super_base_blob<256U>.m_data._M_elems[0xb] = '\0';
    TmpL.super_base_blob<256U>.m_data._M_elems[0xc] = '\0';
    TmpL.super_base_blob<256U>.m_data._M_elems[0xd] = '\0';
    TmpL.super_base_blob<256U>.m_data._M_elems[0xe] = '\0';
    TmpL.super_base_blob<256U>.m_data._M_elems[0xf] = '\0';
    puVar1 = TmpL.super_base_blob<256U>.m_data._M_elems + (uVar11 >> 3);
    *puVar1 = *puVar1 | (byte)(1 << (~(byte)uVar11 & 7));
    local_160 = 
    "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/uint256_tests.cpp"
    ;
    local_158 = "";
    local_170 = &boost::unit_test::basic_cstring<char_const>::null;
    local_168 = &boost::unit_test::basic_cstring<char_const>::null;
    file.m_end = (iterator)0x86;
    file.m_begin = (iterator)&local_160;
    msg.m_end = in_R9;
    msg.m_begin = in_R8;
    boost::unit_test::unit_test_log_t::set_checkpoint
              (boost::unit_test::(anonymous_namespace)::unit_test_log,file,(size_t)&local_170,msg);
    local_98[8] = false;
    local_98._0_8_ = &PTR__lazy_ostream_013d3cb0;
    sStack_88.pi_._0_7_ = 0x13e8138;
    sStack_88.pi_._7_1_ = 0;
    local_80 = 0xf98c4c;
    uStack_79 = 0;
    iVar8 = memcmp(&LastL,(sp_counted_base *)&TmpL,0x20);
    TmpS.super_base_blob<160U>.m_data._M_elems[0] = (uchar)((uint)iVar8 >> 0x1f);
    TmpS.super_base_blob<160U>.m_data._M_elems[8] = '\0';
    TmpS.super_base_blob<160U>.m_data._M_elems[9] = '\0';
    TmpS.super_base_blob<160U>.m_data._M_elems[10] = '\0';
    TmpS.super_base_blob<160U>.m_data._M_elems[0xb] = '\0';
    TmpS.super_base_blob<160U>.m_data._M_elems[0xc] = '\0';
    TmpS.super_base_blob<160U>.m_data._M_elems[0xd] = '\0';
    TmpS.super_base_blob<160U>.m_data._M_elems[0xe] = '\0';
    TmpS.super_base_blob<160U>.m_data._M_elems[0xf] = '\0';
    TmpS.super_base_blob<160U>.m_data._M_elems[0x10] = '\0';
    TmpS.super_base_blob<160U>.m_data._M_elems[0x11] = '\0';
    TmpS.super_base_blob<160U>.m_data._M_elems[0x12] = '\0';
    TmpS.super_base_blob<160U>.m_data._M_elems[0x13] = '\0';
    local_f0._0_8_ =
         "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/uint256_tests.cpp"
    ;
    local_f0.m_message.px = (element_type *)0xf966cf;
    local_118 = '\0';
    local_120 = &PTR__lazy_ostream_013d4988;
    local_110 = boost::unit_test::lazy_ostream::inst;
    local_108 = &LastS;
    local_140 = 0;
    local_148 = &PTR__lazy_ostream_013d4988;
    local_138 = boost::unit_test::lazy_ostream::inst;
    local_130 = (uint160 *)&local_100;
    in_R8 = (iterator)0x1;
    in_R9 = (iterator)0x4;
    local_100.pi_ = (sp_counted_base *)&TmpL;
    LastS.super_base_blob<160U>.m_data._M_elems._0_8_ = &LastL;
    boost::test_tools::tt_detail::report_assertion
              ((assertion_result *)&TmpS,(lazy_ostream *)local_98,1,4,REQUIRE,0xf96b71,
               (size_t)&local_f0,0x86,&local_120,"TmpL",&local_148);
    boost::detail::shared_count::~shared_count
              ((shared_count *)(TmpS.super_base_blob<160U>.m_data._M_elems + 0x10));
    uVar4._0_1_ = TmpL.super_base_blob<256U>.m_data._M_elems[0];
    uVar4._1_1_ = TmpL.super_base_blob<256U>.m_data._M_elems[1];
    uVar4._2_1_ = TmpL.super_base_blob<256U>.m_data._M_elems[2];
    uVar4._3_1_ = TmpL.super_base_blob<256U>.m_data._M_elems[3];
    uVar4._4_1_ = TmpL.super_base_blob<256U>.m_data._M_elems[4];
    uVar4._5_1_ = TmpL.super_base_blob<256U>.m_data._M_elems[5];
    uVar4._6_1_ = TmpL.super_base_blob<256U>.m_data._M_elems[6];
    uVar4._7_1_ = TmpL.super_base_blob<256U>.m_data._M_elems[7];
    uVar5._0_1_ = TmpL.super_base_blob<256U>.m_data._M_elems[8];
    uVar5._1_1_ = TmpL.super_base_blob<256U>.m_data._M_elems[9];
    uVar5._2_1_ = TmpL.super_base_blob<256U>.m_data._M_elems[10];
    uVar5._3_1_ = TmpL.super_base_blob<256U>.m_data._M_elems[0xb];
    uVar5._4_1_ = TmpL.super_base_blob<256U>.m_data._M_elems[0xc];
    uVar5._5_1_ = TmpL.super_base_blob<256U>.m_data._M_elems[0xd];
    uVar5._6_1_ = TmpL.super_base_blob<256U>.m_data._M_elems[0xe];
    uVar5._7_1_ = TmpL.super_base_blob<256U>.m_data._M_elems[0xf];
    uVar6._0_1_ = TmpL.super_base_blob<256U>.m_data._M_elems[0x10];
    uVar6._1_1_ = TmpL.super_base_blob<256U>.m_data._M_elems[0x11];
    uVar6._2_1_ = TmpL.super_base_blob<256U>.m_data._M_elems[0x12];
    uVar6._3_1_ = TmpL.super_base_blob<256U>.m_data._M_elems[0x13];
    uVar6._4_1_ = TmpL.super_base_blob<256U>.m_data._M_elems[0x14];
    uVar6._5_1_ = TmpL.super_base_blob<256U>.m_data._M_elems[0x15];
    uVar6._6_1_ = TmpL.super_base_blob<256U>.m_data._M_elems[0x16];
    uVar6._7_1_ = TmpL.super_base_blob<256U>.m_data._M_elems[0x17];
    uVar7._0_1_ = TmpL.super_base_blob<256U>.m_data._M_elems[0x18];
    uVar7._1_1_ = TmpL.super_base_blob<256U>.m_data._M_elems[0x19];
    uVar7._2_1_ = TmpL.super_base_blob<256U>.m_data._M_elems[0x1a];
    uVar7._3_1_ = TmpL.super_base_blob<256U>.m_data._M_elems[0x1b];
    uVar7._4_1_ = TmpL.super_base_blob<256U>.m_data._M_elems[0x1c];
    uVar7._5_1_ = TmpL.super_base_blob<256U>.m_data._M_elems[0x1d];
    uVar7._6_1_ = TmpL.super_base_blob<256U>.m_data._M_elems[0x1e];
    uVar7._7_1_ = TmpL.super_base_blob<256U>.m_data._M_elems[0x1f];
    LastL.super_base_blob<256U>.m_data._M_elems[0] = TmpL.super_base_blob<256U>.m_data._M_elems[0];
    LastL.super_base_blob<256U>.m_data._M_elems[1] = TmpL.super_base_blob<256U>.m_data._M_elems[1];
    LastL.super_base_blob<256U>.m_data._M_elems[2] = TmpL.super_base_blob<256U>.m_data._M_elems[2];
    LastL.super_base_blob<256U>.m_data._M_elems[3] = TmpL.super_base_blob<256U>.m_data._M_elems[3];
    LastL.super_base_blob<256U>.m_data._M_elems[4] = TmpL.super_base_blob<256U>.m_data._M_elems[4];
    LastL.super_base_blob<256U>.m_data._M_elems[5] = TmpL.super_base_blob<256U>.m_data._M_elems[5];
    LastL.super_base_blob<256U>.m_data._M_elems[6] = TmpL.super_base_blob<256U>.m_data._M_elems[6];
    LastL.super_base_blob<256U>.m_data._M_elems[7] = TmpL.super_base_blob<256U>.m_data._M_elems[7];
    LastL.super_base_blob<256U>.m_data._M_elems[8] = TmpL.super_base_blob<256U>.m_data._M_elems[8];
    LastL.super_base_blob<256U>.m_data._M_elems[9] = TmpL.super_base_blob<256U>.m_data._M_elems[9];
    LastL.super_base_blob<256U>.m_data._M_elems[10] = TmpL.super_base_blob<256U>.m_data._M_elems[10]
    ;
    LastL.super_base_blob<256U>.m_data._M_elems[0xb] =
         TmpL.super_base_blob<256U>.m_data._M_elems[0xb];
    LastL.super_base_blob<256U>.m_data._M_elems[0xc] =
         TmpL.super_base_blob<256U>.m_data._M_elems[0xc];
    LastL.super_base_blob<256U>.m_data._M_elems[0xd] =
         TmpL.super_base_blob<256U>.m_data._M_elems[0xd];
    LastL.super_base_blob<256U>.m_data._M_elems[0xe] =
         TmpL.super_base_blob<256U>.m_data._M_elems[0xe];
    LastL.super_base_blob<256U>.m_data._M_elems[0xf] =
         TmpL.super_base_blob<256U>.m_data._M_elems[0xf];
    LastL.super_base_blob<256U>.m_data._M_elems[0x10] =
         TmpL.super_base_blob<256U>.m_data._M_elems[0x10];
    LastL.super_base_blob<256U>.m_data._M_elems[0x11] =
         TmpL.super_base_blob<256U>.m_data._M_elems[0x11];
    LastL.super_base_blob<256U>.m_data._M_elems[0x12] =
         TmpL.super_base_blob<256U>.m_data._M_elems[0x12];
    LastL.super_base_blob<256U>.m_data._M_elems[0x13] =
         TmpL.super_base_blob<256U>.m_data._M_elems[0x13];
    LastL.super_base_blob<256U>.m_data._M_elems[0x14] =
         TmpL.super_base_blob<256U>.m_data._M_elems[0x14];
    LastL.super_base_blob<256U>.m_data._M_elems[0x15] =
         TmpL.super_base_blob<256U>.m_data._M_elems[0x15];
    LastL.super_base_blob<256U>.m_data._M_elems[0x16] =
         TmpL.super_base_blob<256U>.m_data._M_elems[0x16];
    LastL.super_base_blob<256U>.m_data._M_elems[0x17] =
         TmpL.super_base_blob<256U>.m_data._M_elems[0x17];
    LastL.super_base_blob<256U>.m_data._M_elems[0x18] =
         TmpL.super_base_blob<256U>.m_data._M_elems[0x18];
    LastL.super_base_blob<256U>.m_data._M_elems[0x19] =
         TmpL.super_base_blob<256U>.m_data._M_elems[0x19];
    LastL.super_base_blob<256U>.m_data._M_elems[0x1a] =
         TmpL.super_base_blob<256U>.m_data._M_elems[0x1a];
    LastL.super_base_blob<256U>.m_data._M_elems[0x1b] =
         TmpL.super_base_blob<256U>.m_data._M_elems[0x1b];
    LastL.super_base_blob<256U>.m_data._M_elems[0x1c] =
         TmpL.super_base_blob<256U>.m_data._M_elems[0x1c];
    LastL.super_base_blob<256U>.m_data._M_elems[0x1d] =
         TmpL.super_base_blob<256U>.m_data._M_elems[0x1d];
    LastL.super_base_blob<256U>.m_data._M_elems[0x1e] =
         TmpL.super_base_blob<256U>.m_data._M_elems[0x1e];
    LastL.super_base_blob<256U>.m_data._M_elems[0x1f] =
         TmpL.super_base_blob<256U>.m_data._M_elems[0x1f];
    bVar12 = uVar11 != 0;
    uVar11 = uVar11 - 1;
  } while (bVar12);
  local_180 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/uint256_tests.cpp";
  local_178 = "";
  local_190 = &boost::unit_test::basic_cstring<char_const>::null;
  local_188 = &boost::unit_test::basic_cstring<char_const>::null;
  file_00.m_end = (iterator)0x8a;
  file_00.m_begin = (iterator)&local_180;
  msg_00.m_end = in_R9;
  msg_00.m_begin = in_R8;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_00,(size_t)&local_190,
             msg_00);
  TmpL.super_base_blob<256U>.m_data._M_elems._8_8_ =
       TmpL.super_base_blob<256U>.m_data._M_elems._8_8_ & 0xffffffffffffff00;
  TmpL.super_base_blob<256U>.m_data._M_elems._0_8_ = &PTR__lazy_ostream_013d3cb0;
  TmpL.super_base_blob<256U>.m_data._M_elems._16_8_ = boost::unit_test::lazy_ostream::inst;
  TmpL.super_base_blob<256U>.m_data._M_elems._24_8_ = (long)"\x05\x04\x03\x02\x01" + 5;
  iVar8 = memcmp(ZeroL,&R1L,0x20);
  local_98[8] = false;
  uStack_8f = 0;
  uStack_89 = 0;
  sStack_88.pi_._0_7_ = 0;
  sStack_88.pi_._7_1_ = 0;
  TmpS.super_base_blob<160U>.m_data._M_elems[0] = 'p';
  TmpS.super_base_blob<160U>.m_data._M_elems[1] = 'f';
  TmpS.super_base_blob<160U>.m_data._M_elems[2] = 0xf9;
  TmpS.super_base_blob<160U>.m_data._M_elems[3] = '\0';
  TmpS.super_base_blob<160U>.m_data._M_elems[4] = '\0';
  TmpS.super_base_blob<160U>.m_data._M_elems[5] = '\0';
  TmpS.super_base_blob<160U>.m_data._M_elems[6] = '\0';
  TmpS.super_base_blob<160U>.m_data._M_elems[7] = '\0';
  TmpS.super_base_blob<160U>.m_data._M_elems[8] = 0xcf;
  TmpS.super_base_blob<160U>.m_data._M_elems[9] = 'f';
  TmpS.super_base_blob<160U>.m_data._M_elems[10] = 0xf9;
  TmpS.super_base_blob<160U>.m_data._M_elems[0xb] = '\0';
  TmpS.super_base_blob<160U>.m_data._M_elems[0xc] = '\0';
  TmpS.super_base_blob<160U>.m_data._M_elems[0xd] = '\0';
  TmpS.super_base_blob<160U>.m_data._M_elems[0xe] = '\0';
  TmpS.super_base_blob<160U>.m_data._M_elems[0xf] = '\0';
  local_f0._0_8_ = ZeroL;
  local_118 = '\0';
  local_120 = &PTR__lazy_ostream_013d4988;
  local_110 = boost::unit_test::lazy_ostream::inst;
  local_108 = (uint160 *)&local_f0;
  LastS.super_base_blob<160U>.m_data._M_elems._0_8_ = &R1L;
  local_140 = 0;
  local_148 = &PTR__lazy_ostream_013d4988;
  local_138 = boost::unit_test::lazy_ostream::inst;
  local_130 = &LastS;
  pvVar9 = (iterator)0x1;
  pvVar10 = (iterator)0x4;
  local_98[0] = (class_property<bool>)(bool)SUB41((uint)iVar8 >> 0x1f,0);
  boost::test_tools::tt_detail::report_assertion
            ((assertion_result *)local_98,(lazy_ostream *)&TmpL,1,4,REQUIRE,0xe85219,(size_t)&TmpS,
             0x8a,&local_120,"R1L",&local_148);
  boost::detail::shared_count::~shared_count(&sStack_88);
  local_1a0 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/uint256_tests.cpp";
  local_198 = "";
  local_1b0 = &boost::unit_test::basic_cstring<char_const>::null;
  local_1a8 = &boost::unit_test::basic_cstring<char_const>::null;
  file_01.m_end = (iterator)0x8b;
  file_01.m_begin = (iterator)&local_1a0;
  msg_01.m_end = pvVar10;
  msg_01.m_begin = pvVar9;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_01,(size_t)&local_1b0,
             msg_01);
  TmpL.super_base_blob<256U>.m_data._M_elems._8_8_ =
       TmpL.super_base_blob<256U>.m_data._M_elems._8_8_ & 0xffffffffffffff00;
  TmpL.super_base_blob<256U>.m_data._M_elems._0_8_ = &PTR__lazy_ostream_013d3cb0;
  TmpL.super_base_blob<256U>.m_data._M_elems._16_8_ = boost::unit_test::lazy_ostream::inst;
  TmpL.super_base_blob<256U>.m_data._M_elems._24_8_ = (long)"\x05\x04\x03\x02\x01" + 5;
  iVar8 = memcmp(&R2L,&R1L,0x20);
  local_98[0] = SUB41((uint)iVar8 >> 0x1f,0);
  local_98[8] = false;
  uStack_8f = 0;
  uStack_89 = 0;
  sStack_88.pi_._0_7_ = 0;
  sStack_88.pi_._7_1_ = 0;
  TmpS.super_base_blob<160U>.m_data._M_elems[0] = 'p';
  TmpS.super_base_blob<160U>.m_data._M_elems[1] = 'f';
  TmpS.super_base_blob<160U>.m_data._M_elems[2] = 0xf9;
  TmpS.super_base_blob<160U>.m_data._M_elems[3] = '\0';
  TmpS.super_base_blob<160U>.m_data._M_elems[4] = '\0';
  TmpS.super_base_blob<160U>.m_data._M_elems[5] = '\0';
  TmpS.super_base_blob<160U>.m_data._M_elems[6] = '\0';
  TmpS.super_base_blob<160U>.m_data._M_elems[7] = '\0';
  TmpS.super_base_blob<160U>.m_data._M_elems[8] = 0xcf;
  TmpS.super_base_blob<160U>.m_data._M_elems[9] = 'f';
  TmpS.super_base_blob<160U>.m_data._M_elems[10] = 0xf9;
  TmpS.super_base_blob<160U>.m_data._M_elems[0xb] = '\0';
  TmpS.super_base_blob<160U>.m_data._M_elems[0xc] = '\0';
  TmpS.super_base_blob<160U>.m_data._M_elems[0xd] = '\0';
  TmpS.super_base_blob<160U>.m_data._M_elems[0xe] = '\0';
  TmpS.super_base_blob<160U>.m_data._M_elems[0xf] = '\0';
  local_f0._0_8_ = &R2L;
  local_118 = '\0';
  local_120 = &PTR__lazy_ostream_013d4988;
  local_110 = boost::unit_test::lazy_ostream::inst;
  local_108 = (uint160 *)&local_f0;
  LastS.super_base_blob<160U>.m_data._M_elems._0_8_ = &R1L;
  local_140 = 0;
  local_148 = &PTR__lazy_ostream_013d4988;
  local_138 = boost::unit_test::lazy_ostream::inst;
  local_130 = &LastS;
  pvVar9 = (iterator)0x1;
  pvVar10 = (iterator)0x4;
  boost::test_tools::tt_detail::report_assertion
            ((assertion_result *)local_98,(lazy_ostream *)&TmpL,1,4,REQUIRE,0xe8619f,(size_t)&TmpS,
             0x8b,&local_120,"R1L",&local_148);
  boost::detail::shared_count::~shared_count(&sStack_88);
  local_1c0 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/uint256_tests.cpp";
  local_1b8 = "";
  local_1d0 = &boost::unit_test::basic_cstring<char_const>::null;
  local_1c8 = &boost::unit_test::basic_cstring<char_const>::null;
  file_02.m_end = (iterator)0x8c;
  file_02.m_begin = (iterator)&local_1c0;
  msg_02.m_end = pvVar10;
  msg_02.m_begin = pvVar9;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_02,(size_t)&local_1d0,
             msg_02);
  TmpL.super_base_blob<256U>.m_data._M_elems._8_8_ =
       TmpL.super_base_blob<256U>.m_data._M_elems._8_8_ & 0xffffffffffffff00;
  TmpL.super_base_blob<256U>.m_data._M_elems._0_8_ = &PTR__lazy_ostream_013d3cb0;
  TmpL.super_base_blob<256U>.m_data._M_elems._16_8_ = boost::unit_test::lazy_ostream::inst;
  TmpL.super_base_blob<256U>.m_data._M_elems._24_8_ = (long)"\x05\x04\x03\x02\x01" + 5;
  iVar8 = memcmp(ZeroL,OneL,0x20);
  local_98[0] = SUB41((uint)iVar8 >> 0x1f,0);
  local_98[8] = false;
  uStack_8f = 0;
  uStack_89 = 0;
  sStack_88.pi_._0_7_ = 0;
  sStack_88.pi_._7_1_ = 0;
  TmpS.super_base_blob<160U>.m_data._M_elems[0] = 'p';
  TmpS.super_base_blob<160U>.m_data._M_elems[1] = 'f';
  TmpS.super_base_blob<160U>.m_data._M_elems[2] = 0xf9;
  TmpS.super_base_blob<160U>.m_data._M_elems[3] = '\0';
  TmpS.super_base_blob<160U>.m_data._M_elems[4] = '\0';
  TmpS.super_base_blob<160U>.m_data._M_elems[5] = '\0';
  TmpS.super_base_blob<160U>.m_data._M_elems[6] = '\0';
  TmpS.super_base_blob<160U>.m_data._M_elems[7] = '\0';
  TmpS.super_base_blob<160U>.m_data._M_elems[8] = 0xcf;
  TmpS.super_base_blob<160U>.m_data._M_elems[9] = 'f';
  TmpS.super_base_blob<160U>.m_data._M_elems[10] = 0xf9;
  TmpS.super_base_blob<160U>.m_data._M_elems[0xb] = '\0';
  TmpS.super_base_blob<160U>.m_data._M_elems[0xc] = '\0';
  TmpS.super_base_blob<160U>.m_data._M_elems[0xd] = '\0';
  TmpS.super_base_blob<160U>.m_data._M_elems[0xe] = '\0';
  TmpS.super_base_blob<160U>.m_data._M_elems[0xf] = '\0';
  local_f0._0_8_ = ZeroL;
  local_118 = '\0';
  local_120 = &PTR__lazy_ostream_013d4988;
  local_110 = boost::unit_test::lazy_ostream::inst;
  local_108 = (uint160 *)&local_f0;
  LastS.super_base_blob<160U>.m_data._M_elems._0_8_ = OneL;
  local_140 = 0;
  local_148 = &PTR__lazy_ostream_013d4988;
  local_138 = boost::unit_test::lazy_ostream::inst;
  local_130 = &LastS;
  pvVar9 = (iterator)0x1;
  pvVar10 = (iterator)0x4;
  boost::test_tools::tt_detail::report_assertion
            ((assertion_result *)local_98,(lazy_ostream *)&TmpL,1,4,REQUIRE,0xe85219,(size_t)&TmpS,
             0x8c,&local_120,"OneL",&local_148);
  boost::detail::shared_count::~shared_count(&sStack_88);
  local_1e0 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/uint256_tests.cpp";
  local_1d8 = "";
  local_1f0 = &boost::unit_test::basic_cstring<char_const>::null;
  local_1e8 = &boost::unit_test::basic_cstring<char_const>::null;
  file_03.m_end = (iterator)0x8d;
  file_03.m_begin = (iterator)&local_1e0;
  msg_03.m_end = pvVar10;
  msg_03.m_begin = pvVar9;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_03,(size_t)&local_1f0,
             msg_03);
  TmpL.super_base_blob<256U>.m_data._M_elems._8_8_ =
       TmpL.super_base_blob<256U>.m_data._M_elems._8_8_ & 0xffffffffffffff00;
  TmpL.super_base_blob<256U>.m_data._M_elems._0_8_ = &PTR__lazy_ostream_013d3cb0;
  TmpL.super_base_blob<256U>.m_data._M_elems._16_8_ = boost::unit_test::lazy_ostream::inst;
  TmpL.super_base_blob<256U>.m_data._M_elems._24_8_ = (long)"\x05\x04\x03\x02\x01" + 5;
  iVar8 = memcmp(OneL,MaxL,0x20);
  local_98[0] = SUB41((uint)iVar8 >> 0x1f,0);
  local_98[8] = false;
  uStack_8f = 0;
  uStack_89 = 0;
  sStack_88.pi_._0_7_ = 0;
  sStack_88.pi_._7_1_ = 0;
  TmpS.super_base_blob<160U>.m_data._M_elems[0] = 'p';
  TmpS.super_base_blob<160U>.m_data._M_elems[1] = 'f';
  TmpS.super_base_blob<160U>.m_data._M_elems[2] = 0xf9;
  TmpS.super_base_blob<160U>.m_data._M_elems[3] = '\0';
  TmpS.super_base_blob<160U>.m_data._M_elems[4] = '\0';
  TmpS.super_base_blob<160U>.m_data._M_elems[5] = '\0';
  TmpS.super_base_blob<160U>.m_data._M_elems[6] = '\0';
  TmpS.super_base_blob<160U>.m_data._M_elems[7] = '\0';
  TmpS.super_base_blob<160U>.m_data._M_elems[8] = 0xcf;
  TmpS.super_base_blob<160U>.m_data._M_elems[9] = 'f';
  TmpS.super_base_blob<160U>.m_data._M_elems[10] = 0xf9;
  TmpS.super_base_blob<160U>.m_data._M_elems[0xb] = '\0';
  TmpS.super_base_blob<160U>.m_data._M_elems[0xc] = '\0';
  TmpS.super_base_blob<160U>.m_data._M_elems[0xd] = '\0';
  TmpS.super_base_blob<160U>.m_data._M_elems[0xe] = '\0';
  TmpS.super_base_blob<160U>.m_data._M_elems[0xf] = '\0';
  local_f0._0_8_ = OneL;
  local_118 = '\0';
  local_120 = &PTR__lazy_ostream_013d4988;
  local_110 = boost::unit_test::lazy_ostream::inst;
  local_108 = (uint160 *)&local_f0;
  LastS.super_base_blob<160U>.m_data._M_elems._0_8_ = MaxL;
  local_140 = 0;
  local_148 = &PTR__lazy_ostream_013d4988;
  local_138 = boost::unit_test::lazy_ostream::inst;
  local_130 = &LastS;
  pvVar9 = (iterator)0x1;
  pvVar10 = (iterator)0x4;
  boost::test_tools::tt_detail::report_assertion
            ((assertion_result *)local_98,(lazy_ostream *)&TmpL,1,4,REQUIRE,0xe851aa,(size_t)&TmpS,
             0x8d,&local_120,"MaxL",&local_148);
  boost::detail::shared_count::~shared_count(&sStack_88);
  local_200 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/uint256_tests.cpp";
  local_1f8 = "";
  local_210 = &boost::unit_test::basic_cstring<char_const>::null;
  local_208 = &boost::unit_test::basic_cstring<char_const>::null;
  file_04.m_end = (iterator)0x8e;
  file_04.m_begin = (iterator)&local_200;
  msg_04.m_end = pvVar10;
  msg_04.m_begin = pvVar9;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_04,(size_t)&local_210,
             msg_04);
  TmpL.super_base_blob<256U>.m_data._M_elems._8_8_ =
       TmpL.super_base_blob<256U>.m_data._M_elems._8_8_ & 0xffffffffffffff00;
  TmpL.super_base_blob<256U>.m_data._M_elems._0_8_ = &PTR__lazy_ostream_013d3cb0;
  TmpL.super_base_blob<256U>.m_data._M_elems._16_8_ = boost::unit_test::lazy_ostream::inst;
  TmpL.super_base_blob<256U>.m_data._M_elems._24_8_ = (long)"\x05\x04\x03\x02\x01" + 5;
  iVar8 = memcmp(&R1L,MaxL,0x20);
  local_98[0] = SUB41((uint)iVar8 >> 0x1f,0);
  local_98[8] = false;
  uStack_8f = 0;
  uStack_89 = 0;
  sStack_88.pi_._0_7_ = 0;
  sStack_88.pi_._7_1_ = 0;
  TmpS.super_base_blob<160U>.m_data._M_elems[0] = 'p';
  TmpS.super_base_blob<160U>.m_data._M_elems[1] = 'f';
  TmpS.super_base_blob<160U>.m_data._M_elems[2] = 0xf9;
  TmpS.super_base_blob<160U>.m_data._M_elems[3] = '\0';
  TmpS.super_base_blob<160U>.m_data._M_elems[4] = '\0';
  TmpS.super_base_blob<160U>.m_data._M_elems[5] = '\0';
  TmpS.super_base_blob<160U>.m_data._M_elems[6] = '\0';
  TmpS.super_base_blob<160U>.m_data._M_elems[7] = '\0';
  TmpS.super_base_blob<160U>.m_data._M_elems[8] = 0xcf;
  TmpS.super_base_blob<160U>.m_data._M_elems[9] = 'f';
  TmpS.super_base_blob<160U>.m_data._M_elems[10] = 0xf9;
  TmpS.super_base_blob<160U>.m_data._M_elems[0xb] = '\0';
  TmpS.super_base_blob<160U>.m_data._M_elems[0xc] = '\0';
  TmpS.super_base_blob<160U>.m_data._M_elems[0xd] = '\0';
  TmpS.super_base_blob<160U>.m_data._M_elems[0xe] = '\0';
  TmpS.super_base_blob<160U>.m_data._M_elems[0xf] = '\0';
  local_f0._0_8_ = &R1L;
  local_118 = '\0';
  local_120 = &PTR__lazy_ostream_013d4988;
  local_110 = boost::unit_test::lazy_ostream::inst;
  local_108 = (uint160 *)&local_f0;
  LastS.super_base_blob<160U>.m_data._M_elems._0_8_ = MaxL;
  local_140 = 0;
  local_148 = &PTR__lazy_ostream_013d4988;
  local_138 = boost::unit_test::lazy_ostream::inst;
  local_130 = &LastS;
  pvVar9 = (iterator)0x1;
  pvVar10 = (iterator)0x4;
  boost::test_tools::tt_detail::report_assertion
            ((assertion_result *)local_98,(lazy_ostream *)&TmpL,1,4,REQUIRE,0xe872fa,(size_t)&TmpS,
             0x8e,&local_120,"MaxL",&local_148);
  boost::detail::shared_count::~shared_count(&sStack_88);
  local_220 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/uint256_tests.cpp";
  local_218 = "";
  local_230 = &boost::unit_test::basic_cstring<char_const>::null;
  local_228 = &boost::unit_test::basic_cstring<char_const>::null;
  file_05.m_end = (iterator)0x8f;
  file_05.m_begin = (iterator)&local_220;
  msg_05.m_end = pvVar10;
  msg_05.m_begin = pvVar9;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_05,(size_t)&local_230,
             msg_05);
  TmpL.super_base_blob<256U>.m_data._M_elems._8_8_ =
       TmpL.super_base_blob<256U>.m_data._M_elems._8_8_ & 0xffffffffffffff00;
  TmpL.super_base_blob<256U>.m_data._M_elems._0_8_ = &PTR__lazy_ostream_013d3cb0;
  TmpL.super_base_blob<256U>.m_data._M_elems._16_8_ = boost::unit_test::lazy_ostream::inst;
  TmpL.super_base_blob<256U>.m_data._M_elems._24_8_ = (long)"\x05\x04\x03\x02\x01" + 5;
  iVar8 = memcmp(&R2L,MaxL,0x20);
  local_98[0] = SUB41((uint)iVar8 >> 0x1f,0);
  local_98[8] = false;
  uStack_8f = 0;
  uStack_89 = 0;
  sStack_88.pi_._0_7_ = 0;
  sStack_88.pi_._7_1_ = 0;
  TmpS.super_base_blob<160U>.m_data._M_elems[0] = 'p';
  TmpS.super_base_blob<160U>.m_data._M_elems[1] = 'f';
  TmpS.super_base_blob<160U>.m_data._M_elems[2] = 0xf9;
  TmpS.super_base_blob<160U>.m_data._M_elems[3] = '\0';
  TmpS.super_base_blob<160U>.m_data._M_elems[4] = '\0';
  TmpS.super_base_blob<160U>.m_data._M_elems[5] = '\0';
  TmpS.super_base_blob<160U>.m_data._M_elems[6] = '\0';
  TmpS.super_base_blob<160U>.m_data._M_elems[7] = '\0';
  TmpS.super_base_blob<160U>.m_data._M_elems[8] = 0xcf;
  TmpS.super_base_blob<160U>.m_data._M_elems[9] = 'f';
  TmpS.super_base_blob<160U>.m_data._M_elems[10] = 0xf9;
  TmpS.super_base_blob<160U>.m_data._M_elems[0xb] = '\0';
  TmpS.super_base_blob<160U>.m_data._M_elems[0xc] = '\0';
  TmpS.super_base_blob<160U>.m_data._M_elems[0xd] = '\0';
  TmpS.super_base_blob<160U>.m_data._M_elems[0xe] = '\0';
  TmpS.super_base_blob<160U>.m_data._M_elems[0xf] = '\0';
  local_f0._0_8_ = &R2L;
  local_118 = '\0';
  local_120 = &PTR__lazy_ostream_013d4988;
  local_110 = boost::unit_test::lazy_ostream::inst;
  local_108 = (uint160 *)&local_f0;
  LastS.super_base_blob<160U>.m_data._M_elems._0_8_ = MaxL;
  local_140 = 0;
  local_148 = &PTR__lazy_ostream_013d4988;
  local_138 = boost::unit_test::lazy_ostream::inst;
  local_130 = &LastS;
  pvVar9 = (iterator)0x1;
  pvVar10 = (iterator)0x4;
  boost::test_tools::tt_detail::report_assertion
            ((assertion_result *)local_98,(lazy_ostream *)&TmpL,1,4,REQUIRE,0xe8619f,(size_t)&TmpS,
             0x8f,&local_120,"MaxL",&local_148);
  boost::detail::shared_count::~shared_count(&sStack_88);
  LastS.super_base_blob<160U>.m_data._M_elems[0] = '\0';
  LastS.super_base_blob<160U>.m_data._M_elems[1] = '\0';
  LastS.super_base_blob<160U>.m_data._M_elems[2] = '\0';
  LastS.super_base_blob<160U>.m_data._M_elems[3] = '\0';
  LastS.super_base_blob<160U>.m_data._M_elems[4] = '\0';
  LastS.super_base_blob<160U>.m_data._M_elems[5] = '\0';
  LastS.super_base_blob<160U>.m_data._M_elems[6] = '\0';
  LastS.super_base_blob<160U>.m_data._M_elems[7] = '\0';
  LastS.super_base_blob<160U>.m_data._M_elems[8] = '\0';
  LastS.super_base_blob<160U>.m_data._M_elems[9] = '\0';
  LastS.super_base_blob<160U>.m_data._M_elems[10] = '\0';
  LastS.super_base_blob<160U>.m_data._M_elems[0xb] = '\0';
  LastS.super_base_blob<160U>.m_data._M_elems[0xc] = '\0';
  LastS.super_base_blob<160U>.m_data._M_elems[0xd] = '\0';
  LastS.super_base_blob<160U>.m_data._M_elems[0xe] = '\0';
  LastS.super_base_blob<160U>.m_data._M_elems[0xf] = '\0';
  LastS.super_base_blob<160U>.m_data._M_elems[0x10] = '\0';
  LastS.super_base_blob<160U>.m_data._M_elems[0x11] = '\0';
  LastS.super_base_blob<160U>.m_data._M_elems[0x12] = '\0';
  LastS.super_base_blob<160U>.m_data._M_elems[0x13] = '\0';
  uVar11 = 0x9f;
  uVar3 = LastS.super_base_blob<160U>.m_data._M_elems._16_4_;
  do {
    LastS.super_base_blob<160U>.m_data._M_elems._16_4_ = uVar3;
    TmpS.super_base_blob<160U>.m_data._M_elems[0] = '\0';
    TmpS.super_base_blob<160U>.m_data._M_elems[1] = '\0';
    TmpS.super_base_blob<160U>.m_data._M_elems[2] = '\0';
    TmpS.super_base_blob<160U>.m_data._M_elems[3] = '\0';
    TmpS.super_base_blob<160U>.m_data._M_elems[4] = '\0';
    TmpS.super_base_blob<160U>.m_data._M_elems[5] = '\0';
    TmpS.super_base_blob<160U>.m_data._M_elems[6] = '\0';
    TmpS.super_base_blob<160U>.m_data._M_elems[7] = '\0';
    TmpS.super_base_blob<160U>.m_data._M_elems[8] = '\0';
    TmpS.super_base_blob<160U>.m_data._M_elems[9] = '\0';
    TmpS.super_base_blob<160U>.m_data._M_elems[10] = '\0';
    TmpS.super_base_blob<160U>.m_data._M_elems[0xb] = '\0';
    TmpS.super_base_blob<160U>.m_data._M_elems[0xc] = '\0';
    TmpS.super_base_blob<160U>.m_data._M_elems[0xd] = '\0';
    TmpS.super_base_blob<160U>.m_data._M_elems[0xe] = '\0';
    TmpS.super_base_blob<160U>.m_data._M_elems[0xf] = '\0';
    TmpS.super_base_blob<160U>.m_data._M_elems[0x10] = '\0';
    TmpS.super_base_blob<160U>.m_data._M_elems[0x11] = '\0';
    TmpS.super_base_blob<160U>.m_data._M_elems[0x12] = '\0';
    TmpS.super_base_blob<160U>.m_data._M_elems[0x13] = '\0';
    puVar1 = TmpS.super_base_blob<160U>.m_data._M_elems + (uVar11 >> 3);
    *puVar1 = *puVar1 | (byte)(1 << (~(byte)uVar11 & 7));
    local_240 = 
    "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/uint256_tests.cpp"
    ;
    local_238 = "";
    local_250 = &boost::unit_test::basic_cstring<char_const>::null;
    local_248 = &boost::unit_test::basic_cstring<char_const>::null;
    file_06.m_end = (iterator)0x95;
    file_06.m_begin = (iterator)&local_240;
    msg_06.m_end = pvVar10;
    msg_06.m_begin = pvVar9;
    boost::unit_test::unit_test_log_t::set_checkpoint
              (boost::unit_test::(anonymous_namespace)::unit_test_log,file_06,(size_t)&local_250,
               msg_06);
    TmpL.super_base_blob<256U>.m_data._M_elems._8_8_ =
         TmpL.super_base_blob<256U>.m_data._M_elems._8_8_ & 0xffffffffffffff00;
    TmpL.super_base_blob<256U>.m_data._M_elems._0_8_ = &PTR__lazy_ostream_013d3cb0;
    TmpL.super_base_blob<256U>.m_data._M_elems._16_8_ = boost::unit_test::lazy_ostream::inst;
    TmpL.super_base_blob<256U>.m_data._M_elems._24_8_ = (long)"\x05\x04\x03\x02\x01" + 5;
    iVar8 = memcmp((sp_counted_base *)&LastS,&TmpS,0x14);
    local_98[0] = SUB41((uint)iVar8 >> 0x1f,0);
    local_98[8] = false;
    uStack_8f = 0;
    uStack_89 = 0;
    sStack_88.pi_._0_7_ = 0;
    sStack_88.pi_._7_1_ = 0;
    local_f0._0_8_ =
         "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/uint256_tests.cpp"
    ;
    local_f0.m_message.px = (element_type *)0xf966cf;
    local_118 = '\0';
    local_120 = &PTR__lazy_ostream_013d9110;
    local_110 = boost::unit_test::lazy_ostream::inst;
    local_108 = (uint160 *)&local_100;
    local_140 = 0;
    local_148 = &PTR__lazy_ostream_013d9110;
    local_138 = boost::unit_test::lazy_ostream::inst;
    local_130 = (uint160 *)local_128;
    pvVar9 = (iterator)0x1;
    pvVar10 = (iterator)0x4;
    local_128 = (undefined1  [8])&TmpS;
    local_100.pi_ = (sp_counted_base *)&LastS;
    boost::test_tools::tt_detail::report_assertion
              ((assertion_result *)local_98,(lazy_ostream *)&TmpL,1,4,REQUIRE,0xf96b77,
               (size_t)&local_f0,0x95,&local_120,"TmpS",&local_148);
    boost::detail::shared_count::~shared_count(&sStack_88);
    LastS.super_base_blob<160U>.m_data._M_elems[1] = TmpS.super_base_blob<160U>.m_data._M_elems[1];
    LastS.super_base_blob<160U>.m_data._M_elems[2] = TmpS.super_base_blob<160U>.m_data._M_elems[2];
    LastS.super_base_blob<160U>.m_data._M_elems[3] = TmpS.super_base_blob<160U>.m_data._M_elems[3];
    LastS.super_base_blob<160U>.m_data._M_elems[4] = TmpS.super_base_blob<160U>.m_data._M_elems[4];
    LastS.super_base_blob<160U>.m_data._M_elems[5] = TmpS.super_base_blob<160U>.m_data._M_elems[5];
    LastS.super_base_blob<160U>.m_data._M_elems[6] = TmpS.super_base_blob<160U>.m_data._M_elems[6];
    LastS.super_base_blob<160U>.m_data._M_elems[7] = TmpS.super_base_blob<160U>.m_data._M_elems[7];
    LastS.super_base_blob<160U>.m_data._M_elems[0] = TmpS.super_base_blob<160U>.m_data._M_elems[0];
    LastS.super_base_blob<160U>.m_data._M_elems[9] = TmpS.super_base_blob<160U>.m_data._M_elems[9];
    LastS.super_base_blob<160U>.m_data._M_elems[10] = TmpS.super_base_blob<160U>.m_data._M_elems[10]
    ;
    LastS.super_base_blob<160U>.m_data._M_elems[0xb] =
         TmpS.super_base_blob<160U>.m_data._M_elems[0xb];
    LastS.super_base_blob<160U>.m_data._M_elems[0xc] =
         TmpS.super_base_blob<160U>.m_data._M_elems[0xc];
    LastS.super_base_blob<160U>.m_data._M_elems[0xd] =
         TmpS.super_base_blob<160U>.m_data._M_elems[0xd];
    LastS.super_base_blob<160U>.m_data._M_elems[0xe] =
         TmpS.super_base_blob<160U>.m_data._M_elems[0xe];
    LastS.super_base_blob<160U>.m_data._M_elems[0xf] =
         TmpS.super_base_blob<160U>.m_data._M_elems[0xf];
    LastS.super_base_blob<160U>.m_data._M_elems[8] = TmpS.super_base_blob<160U>.m_data._M_elems[8];
    uVar3._0_1_ = TmpS.super_base_blob<160U>.m_data._M_elems[0x10];
    uVar3._1_1_ = TmpS.super_base_blob<160U>.m_data._M_elems[0x11];
    uVar3._2_1_ = TmpS.super_base_blob<160U>.m_data._M_elems[0x12];
    uVar3._3_1_ = TmpS.super_base_blob<160U>.m_data._M_elems[0x13];
    LastS.super_base_blob<160U>.m_data._M_elems[0x10] =
         TmpS.super_base_blob<160U>.m_data._M_elems[0x10];
    LastS.super_base_blob<160U>.m_data._M_elems[0x11] =
         TmpS.super_base_blob<160U>.m_data._M_elems[0x11];
    LastS.super_base_blob<160U>.m_data._M_elems[0x12] =
         TmpS.super_base_blob<160U>.m_data._M_elems[0x12];
    LastS.super_base_blob<160U>.m_data._M_elems[0x13] =
         TmpS.super_base_blob<160U>.m_data._M_elems[0x13];
    bVar12 = uVar11 != 0;
    uVar11 = uVar11 - 1;
  } while (bVar12);
  local_260 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/uint256_tests.cpp";
  local_258 = "";
  local_270 = &boost::unit_test::basic_cstring<char_const>::null;
  local_268 = &boost::unit_test::basic_cstring<char_const>::null;
  file_07.m_end = (iterator)0x98;
  file_07.m_begin = (iterator)&local_260;
  msg_07.m_end = pvVar10;
  msg_07.m_begin = pvVar9;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_07,(size_t)&local_270,
             msg_07);
  TmpL.super_base_blob<256U>.m_data._M_elems._8_8_ =
       TmpL.super_base_blob<256U>.m_data._M_elems._8_8_ & 0xffffffffffffff00;
  TmpL.super_base_blob<256U>.m_data._M_elems._0_8_ = &PTR__lazy_ostream_013d3cb0;
  TmpL.super_base_blob<256U>.m_data._M_elems._16_8_ = boost::unit_test::lazy_ostream::inst;
  TmpL.super_base_blob<256U>.m_data._M_elems._24_8_ = (long)"\x05\x04\x03\x02\x01" + 5;
  iVar8 = memcmp(ZeroS,R1S,0x14);
  local_98[0] = SUB41((uint)iVar8 >> 0x1f,0);
  local_98[8] = false;
  uStack_8f = 0;
  uStack_89 = 0;
  sStack_88.pi_._0_7_ = 0;
  sStack_88.pi_._7_1_ = 0;
  TmpS.super_base_blob<160U>.m_data._M_elems[0] = 'p';
  TmpS.super_base_blob<160U>.m_data._M_elems[1] = 'f';
  TmpS.super_base_blob<160U>.m_data._M_elems[2] = 0xf9;
  TmpS.super_base_blob<160U>.m_data._M_elems[3] = '\0';
  TmpS.super_base_blob<160U>.m_data._M_elems[4] = '\0';
  TmpS.super_base_blob<160U>.m_data._M_elems[5] = '\0';
  TmpS.super_base_blob<160U>.m_data._M_elems[6] = '\0';
  TmpS.super_base_blob<160U>.m_data._M_elems[7] = '\0';
  TmpS.super_base_blob<160U>.m_data._M_elems[8] = 0xcf;
  TmpS.super_base_blob<160U>.m_data._M_elems[9] = 'f';
  TmpS.super_base_blob<160U>.m_data._M_elems[10] = 0xf9;
  TmpS.super_base_blob<160U>.m_data._M_elems[0xb] = '\0';
  TmpS.super_base_blob<160U>.m_data._M_elems[0xc] = '\0';
  TmpS.super_base_blob<160U>.m_data._M_elems[0xd] = '\0';
  TmpS.super_base_blob<160U>.m_data._M_elems[0xe] = '\0';
  TmpS.super_base_blob<160U>.m_data._M_elems[0xf] = '\0';
  local_f0._0_8_ = ZeroS;
  local_118 = '\0';
  local_120 = &PTR__lazy_ostream_013d9110;
  local_110 = boost::unit_test::lazy_ostream::inst;
  local_108 = (uint160 *)&local_f0;
  local_100.pi_ = (sp_counted_base *)R1S;
  local_140 = 0;
  local_148 = &PTR__lazy_ostream_013d9110;
  local_138 = boost::unit_test::lazy_ostream::inst;
  local_130 = (uint160 *)&local_100;
  pvVar9 = (iterator)0x1;
  pvVar10 = (iterator)0x4;
  boost::test_tools::tt_detail::report_assertion
            ((assertion_result *)local_98,(lazy_ostream *)&TmpL,1,4,REQUIRE,0xf967be,(size_t)&TmpS,
             0x98,&local_120,"R1S",&local_148);
  boost::detail::shared_count::~shared_count(&sStack_88);
  local_280 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/uint256_tests.cpp";
  local_278 = "";
  local_290 = &boost::unit_test::basic_cstring<char_const>::null;
  local_288 = &boost::unit_test::basic_cstring<char_const>::null;
  file_08.m_end = (iterator)0x99;
  file_08.m_begin = (iterator)&local_280;
  msg_08.m_end = pvVar10;
  msg_08.m_begin = pvVar9;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_08,(size_t)&local_290,
             msg_08);
  TmpL.super_base_blob<256U>.m_data._M_elems._8_8_ =
       TmpL.super_base_blob<256U>.m_data._M_elems._8_8_ & 0xffffffffffffff00;
  TmpL.super_base_blob<256U>.m_data._M_elems._0_8_ = &PTR__lazy_ostream_013d3cb0;
  TmpL.super_base_blob<256U>.m_data._M_elems._16_8_ = boost::unit_test::lazy_ostream::inst;
  TmpL.super_base_blob<256U>.m_data._M_elems._24_8_ = (long)"\x05\x04\x03\x02\x01" + 5;
  iVar8 = memcmp(R2S,R1S,0x14);
  local_98[0] = SUB41((uint)iVar8 >> 0x1f,0);
  local_98[8] = false;
  uStack_8f = 0;
  uStack_89 = 0;
  sStack_88.pi_._0_7_ = 0;
  sStack_88.pi_._7_1_ = 0;
  TmpS.super_base_blob<160U>.m_data._M_elems[0] = 'p';
  TmpS.super_base_blob<160U>.m_data._M_elems[1] = 'f';
  TmpS.super_base_blob<160U>.m_data._M_elems[2] = 0xf9;
  TmpS.super_base_blob<160U>.m_data._M_elems[3] = '\0';
  TmpS.super_base_blob<160U>.m_data._M_elems[4] = '\0';
  TmpS.super_base_blob<160U>.m_data._M_elems[5] = '\0';
  TmpS.super_base_blob<160U>.m_data._M_elems[6] = '\0';
  TmpS.super_base_blob<160U>.m_data._M_elems[7] = '\0';
  TmpS.super_base_blob<160U>.m_data._M_elems[8] = 0xcf;
  TmpS.super_base_blob<160U>.m_data._M_elems[9] = 'f';
  TmpS.super_base_blob<160U>.m_data._M_elems[10] = 0xf9;
  TmpS.super_base_blob<160U>.m_data._M_elems[0xb] = '\0';
  TmpS.super_base_blob<160U>.m_data._M_elems[0xc] = '\0';
  TmpS.super_base_blob<160U>.m_data._M_elems[0xd] = '\0';
  TmpS.super_base_blob<160U>.m_data._M_elems[0xe] = '\0';
  TmpS.super_base_blob<160U>.m_data._M_elems[0xf] = '\0';
  local_f0._0_8_ = R2S;
  local_118 = '\0';
  local_120 = &PTR__lazy_ostream_013d9110;
  local_110 = boost::unit_test::lazy_ostream::inst;
  local_108 = (uint160 *)&local_f0;
  local_100.pi_ = (sp_counted_base *)R1S;
  local_140 = 0;
  local_148 = &PTR__lazy_ostream_013d9110;
  local_138 = boost::unit_test::lazy_ostream::inst;
  local_130 = (uint160 *)&local_100;
  pvVar9 = (iterator)0x1;
  pvVar10 = (iterator)0x4;
  boost::test_tools::tt_detail::report_assertion
            ((assertion_result *)local_98,(lazy_ostream *)&TmpL,1,4,REQUIRE,0xf967ba,(size_t)&TmpS,
             0x99,&local_120,"R1S",&local_148);
  boost::detail::shared_count::~shared_count(&sStack_88);
  local_2a0 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/uint256_tests.cpp";
  local_298 = "";
  local_2b0 = &boost::unit_test::basic_cstring<char_const>::null;
  local_2a8 = &boost::unit_test::basic_cstring<char_const>::null;
  file_09.m_end = (iterator)0x9a;
  file_09.m_begin = (iterator)&local_2a0;
  msg_09.m_end = pvVar10;
  msg_09.m_begin = pvVar9;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_09,(size_t)&local_2b0,
             msg_09);
  TmpL.super_base_blob<256U>.m_data._M_elems._8_8_ =
       TmpL.super_base_blob<256U>.m_data._M_elems._8_8_ & 0xffffffffffffff00;
  TmpL.super_base_blob<256U>.m_data._M_elems._0_8_ = &PTR__lazy_ostream_013d3cb0;
  TmpL.super_base_blob<256U>.m_data._M_elems._16_8_ = boost::unit_test::lazy_ostream::inst;
  TmpL.super_base_blob<256U>.m_data._M_elems._24_8_ = (long)"\x05\x04\x03\x02\x01" + 5;
  iVar8 = memcmp(ZeroS,OneS,0x14);
  local_98[0] = SUB41((uint)iVar8 >> 0x1f,0);
  local_98[8] = false;
  uStack_8f = 0;
  uStack_89 = 0;
  sStack_88.pi_._0_7_ = 0;
  sStack_88.pi_._7_1_ = 0;
  TmpS.super_base_blob<160U>.m_data._M_elems[0] = 'p';
  TmpS.super_base_blob<160U>.m_data._M_elems[1] = 'f';
  TmpS.super_base_blob<160U>.m_data._M_elems[2] = 0xf9;
  TmpS.super_base_blob<160U>.m_data._M_elems[3] = '\0';
  TmpS.super_base_blob<160U>.m_data._M_elems[4] = '\0';
  TmpS.super_base_blob<160U>.m_data._M_elems[5] = '\0';
  TmpS.super_base_blob<160U>.m_data._M_elems[6] = '\0';
  TmpS.super_base_blob<160U>.m_data._M_elems[7] = '\0';
  TmpS.super_base_blob<160U>.m_data._M_elems[8] = 0xcf;
  TmpS.super_base_blob<160U>.m_data._M_elems[9] = 'f';
  TmpS.super_base_blob<160U>.m_data._M_elems[10] = 0xf9;
  TmpS.super_base_blob<160U>.m_data._M_elems[0xb] = '\0';
  TmpS.super_base_blob<160U>.m_data._M_elems[0xc] = '\0';
  TmpS.super_base_blob<160U>.m_data._M_elems[0xd] = '\0';
  TmpS.super_base_blob<160U>.m_data._M_elems[0xe] = '\0';
  TmpS.super_base_blob<160U>.m_data._M_elems[0xf] = '\0';
  local_f0._0_8_ = ZeroS;
  local_118 = '\0';
  local_120 = &PTR__lazy_ostream_013d9110;
  local_110 = boost::unit_test::lazy_ostream::inst;
  local_108 = (uint160 *)&local_f0;
  local_100.pi_ = (sp_counted_base *)OneS;
  local_140 = 0;
  local_148 = &PTR__lazy_ostream_013d9110;
  local_138 = boost::unit_test::lazy_ostream::inst;
  local_130 = (uint160 *)&local_100;
  pvVar9 = (iterator)0x1;
  pvVar10 = (iterator)0x4;
  boost::test_tools::tt_detail::report_assertion
            ((assertion_result *)local_98,(lazy_ostream *)&TmpL,1,4,REQUIRE,0xf967be,(size_t)&TmpS,
             0x9a,&local_120,"OneS",&local_148);
  boost::detail::shared_count::~shared_count(&sStack_88);
  local_2c0 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/uint256_tests.cpp";
  local_2b8 = "";
  local_2d0 = &boost::unit_test::basic_cstring<char_const>::null;
  local_2c8 = &boost::unit_test::basic_cstring<char_const>::null;
  file_10.m_end = (iterator)0x9b;
  file_10.m_begin = (iterator)&local_2c0;
  msg_10.m_end = pvVar10;
  msg_10.m_begin = pvVar9;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_10,(size_t)&local_2d0,
             msg_10);
  TmpL.super_base_blob<256U>.m_data._M_elems._8_8_ =
       TmpL.super_base_blob<256U>.m_data._M_elems._8_8_ & 0xffffffffffffff00;
  TmpL.super_base_blob<256U>.m_data._M_elems._0_8_ = &PTR__lazy_ostream_013d3cb0;
  TmpL.super_base_blob<256U>.m_data._M_elems._16_8_ = boost::unit_test::lazy_ostream::inst;
  TmpL.super_base_blob<256U>.m_data._M_elems._24_8_ = (long)"\x05\x04\x03\x02\x01" + 5;
  iVar8 = memcmp(OneS,MaxS,0x14);
  local_98[0] = SUB41((uint)iVar8 >> 0x1f,0);
  local_98[8] = false;
  uStack_8f = 0;
  uStack_89 = 0;
  sStack_88.pi_._0_7_ = 0;
  sStack_88.pi_._7_1_ = 0;
  TmpS.super_base_blob<160U>.m_data._M_elems[0] = 'p';
  TmpS.super_base_blob<160U>.m_data._M_elems[1] = 'f';
  TmpS.super_base_blob<160U>.m_data._M_elems[2] = 0xf9;
  TmpS.super_base_blob<160U>.m_data._M_elems[3] = '\0';
  TmpS.super_base_blob<160U>.m_data._M_elems[4] = '\0';
  TmpS.super_base_blob<160U>.m_data._M_elems[5] = '\0';
  TmpS.super_base_blob<160U>.m_data._M_elems[6] = '\0';
  TmpS.super_base_blob<160U>.m_data._M_elems[7] = '\0';
  TmpS.super_base_blob<160U>.m_data._M_elems[8] = 0xcf;
  TmpS.super_base_blob<160U>.m_data._M_elems[9] = 'f';
  TmpS.super_base_blob<160U>.m_data._M_elems[10] = 0xf9;
  TmpS.super_base_blob<160U>.m_data._M_elems[0xb] = '\0';
  TmpS.super_base_blob<160U>.m_data._M_elems[0xc] = '\0';
  TmpS.super_base_blob<160U>.m_data._M_elems[0xd] = '\0';
  TmpS.super_base_blob<160U>.m_data._M_elems[0xe] = '\0';
  TmpS.super_base_blob<160U>.m_data._M_elems[0xf] = '\0';
  local_f0._0_8_ = OneS;
  local_118 = '\0';
  local_120 = &PTR__lazy_ostream_013d9110;
  local_110 = boost::unit_test::lazy_ostream::inst;
  local_108 = (uint160 *)&local_f0;
  local_100.pi_ = (sp_counted_base *)MaxS;
  local_140 = 0;
  local_148 = &PTR__lazy_ostream_013d9110;
  local_138 = boost::unit_test::lazy_ostream::inst;
  local_130 = (uint160 *)&local_100;
  pvVar9 = (iterator)0x1;
  pvVar10 = (iterator)0x4;
  boost::test_tools::tt_detail::report_assertion
            ((assertion_result *)local_98,(lazy_ostream *)&TmpL,1,4,REQUIRE,0xf967c4,(size_t)&TmpS,
             0x9b,&local_120,"MaxS",&local_148);
  boost::detail::shared_count::~shared_count(&sStack_88);
  local_2e0 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/uint256_tests.cpp";
  local_2d8 = "";
  local_2f0 = &boost::unit_test::basic_cstring<char_const>::null;
  local_2e8 = &boost::unit_test::basic_cstring<char_const>::null;
  file_11.m_end = (iterator)0x9c;
  file_11.m_begin = (iterator)&local_2e0;
  msg_11.m_end = pvVar10;
  msg_11.m_begin = pvVar9;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_11,(size_t)&local_2f0,
             msg_11);
  TmpL.super_base_blob<256U>.m_data._M_elems._8_8_ =
       TmpL.super_base_blob<256U>.m_data._M_elems._8_8_ & 0xffffffffffffff00;
  TmpL.super_base_blob<256U>.m_data._M_elems._0_8_ = &PTR__lazy_ostream_013d3cb0;
  TmpL.super_base_blob<256U>.m_data._M_elems._16_8_ = boost::unit_test::lazy_ostream::inst;
  TmpL.super_base_blob<256U>.m_data._M_elems._24_8_ = (long)"\x05\x04\x03\x02\x01" + 5;
  iVar8 = memcmp(R1S,MaxS,0x14);
  local_98[0] = SUB41((uint)iVar8 >> 0x1f,0);
  local_98[8] = false;
  uStack_8f = 0;
  uStack_89 = 0;
  sStack_88.pi_._0_7_ = 0;
  sStack_88.pi_._7_1_ = 0;
  TmpS.super_base_blob<160U>.m_data._M_elems[0] = 'p';
  TmpS.super_base_blob<160U>.m_data._M_elems[1] = 'f';
  TmpS.super_base_blob<160U>.m_data._M_elems[2] = 0xf9;
  TmpS.super_base_blob<160U>.m_data._M_elems[3] = '\0';
  TmpS.super_base_blob<160U>.m_data._M_elems[4] = '\0';
  TmpS.super_base_blob<160U>.m_data._M_elems[5] = '\0';
  TmpS.super_base_blob<160U>.m_data._M_elems[6] = '\0';
  TmpS.super_base_blob<160U>.m_data._M_elems[7] = '\0';
  TmpS.super_base_blob<160U>.m_data._M_elems[8] = 0xcf;
  TmpS.super_base_blob<160U>.m_data._M_elems[9] = 'f';
  TmpS.super_base_blob<160U>.m_data._M_elems[10] = 0xf9;
  TmpS.super_base_blob<160U>.m_data._M_elems[0xb] = '\0';
  TmpS.super_base_blob<160U>.m_data._M_elems[0xc] = '\0';
  TmpS.super_base_blob<160U>.m_data._M_elems[0xd] = '\0';
  TmpS.super_base_blob<160U>.m_data._M_elems[0xe] = '\0';
  TmpS.super_base_blob<160U>.m_data._M_elems[0xf] = '\0';
  local_f0._0_8_ = R1S;
  local_118 = '\0';
  local_120 = &PTR__lazy_ostream_013d9110;
  local_110 = boost::unit_test::lazy_ostream::inst;
  local_108 = (uint160 *)&local_f0;
  local_100.pi_ = (sp_counted_base *)MaxS;
  local_140 = 0;
  local_148 = &PTR__lazy_ostream_013d9110;
  local_138 = boost::unit_test::lazy_ostream::inst;
  local_130 = (uint160 *)&local_100;
  pvVar9 = (iterator)0x1;
  pvVar10 = (iterator)0x4;
  boost::test_tools::tt_detail::report_assertion
            ((assertion_result *)local_98,(lazy_ostream *)&TmpL,1,4,REQUIRE,0xf967b6,(size_t)&TmpS,
             0x9c,&local_120,"MaxS",&local_148);
  boost::detail::shared_count::~shared_count(&sStack_88);
  local_300 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/uint256_tests.cpp";
  local_2f8 = "";
  local_310 = &boost::unit_test::basic_cstring<char_const>::null;
  local_308 = &boost::unit_test::basic_cstring<char_const>::null;
  file_12.m_end = (iterator)0x9d;
  file_12.m_begin = (iterator)&local_300;
  msg_12.m_end = pvVar10;
  msg_12.m_begin = pvVar9;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_12,(size_t)&local_310,
             msg_12);
  TmpL.super_base_blob<256U>.m_data._M_elems._8_8_ =
       TmpL.super_base_blob<256U>.m_data._M_elems._8_8_ & 0xffffffffffffff00;
  TmpL.super_base_blob<256U>.m_data._M_elems._0_8_ = &PTR__lazy_ostream_013d3cb0;
  TmpL.super_base_blob<256U>.m_data._M_elems._16_8_ = boost::unit_test::lazy_ostream::inst;
  TmpL.super_base_blob<256U>.m_data._M_elems._24_8_ = (long)"\x05\x04\x03\x02\x01" + 5;
  iVar8 = memcmp(R2S,MaxS,0x14);
  local_98[0] = SUB41((uint)iVar8 >> 0x1f,0);
  local_98[8] = false;
  uStack_8f = 0;
  uStack_89 = 0;
  sStack_88.pi_._0_7_ = 0;
  sStack_88.pi_._7_1_ = 0;
  TmpS.super_base_blob<160U>.m_data._M_elems[0] = 'p';
  TmpS.super_base_blob<160U>.m_data._M_elems[1] = 'f';
  TmpS.super_base_blob<160U>.m_data._M_elems[2] = 0xf9;
  TmpS.super_base_blob<160U>.m_data._M_elems[3] = '\0';
  TmpS.super_base_blob<160U>.m_data._M_elems[4] = '\0';
  TmpS.super_base_blob<160U>.m_data._M_elems[5] = '\0';
  TmpS.super_base_blob<160U>.m_data._M_elems[6] = '\0';
  TmpS.super_base_blob<160U>.m_data._M_elems[7] = '\0';
  TmpS.super_base_blob<160U>.m_data._M_elems[8] = 0xcf;
  TmpS.super_base_blob<160U>.m_data._M_elems[9] = 'f';
  TmpS.super_base_blob<160U>.m_data._M_elems[10] = 0xf9;
  TmpS.super_base_blob<160U>.m_data._M_elems[0xb] = '\0';
  TmpS.super_base_blob<160U>.m_data._M_elems[0xc] = '\0';
  TmpS.super_base_blob<160U>.m_data._M_elems[0xd] = '\0';
  TmpS.super_base_blob<160U>.m_data._M_elems[0xe] = '\0';
  TmpS.super_base_blob<160U>.m_data._M_elems[0xf] = '\0';
  local_f0._0_8_ = R2S;
  local_118 = '\0';
  local_120 = &PTR__lazy_ostream_013d9110;
  local_110 = boost::unit_test::lazy_ostream::inst;
  local_108 = (uint160 *)&local_f0;
  local_100.pi_ = (sp_counted_base *)MaxS;
  local_140 = 0;
  local_148 = &PTR__lazy_ostream_013d9110;
  local_138 = boost::unit_test::lazy_ostream::inst;
  local_130 = (uint160 *)&local_100;
  pvVar9 = (iterator)0x1;
  pvVar10 = (iterator)0x4;
  boost::test_tools::tt_detail::report_assertion
            ((assertion_result *)local_98,(lazy_ostream *)&TmpL,1,4,REQUIRE,0xf967ba,(size_t)&TmpS,
             0x9d,&local_120,"MaxS",&local_148);
  boost::detail::shared_count::~shared_count(&sStack_88);
  local_320 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/uint256_tests.cpp";
  local_318 = "";
  local_330 = &boost::unit_test::basic_cstring<char_const>::null;
  local_328 = &boost::unit_test::basic_cstring<char_const>::null;
  file_13.m_end = (iterator)0xa0;
  file_13.m_begin = (iterator)&local_320;
  msg_13.m_end = pvVar10;
  msg_13.m_begin = pvVar9;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_13,(size_t)&local_330,
             msg_13);
  TmpL.super_base_blob<256U>.m_data._M_elems._8_8_ =
       TmpL.super_base_blob<256U>.m_data._M_elems._8_8_ & 0xffffffffffffff00;
  TmpL.super_base_blob<256U>.m_data._M_elems._0_8_ = &PTR__lazy_ostream_013d3cb0;
  TmpL.super_base_blob<256U>.m_data._M_elems._16_8_ = boost::unit_test::lazy_ostream::inst;
  TmpL.super_base_blob<256U>.m_data._M_elems._24_8_ = (long)"\x05\x04\x03\x02\x01" + 5;
  iVar8 = memcmp(&R2L,&R1L,0x20);
  local_98[0] = SUB41((uint)iVar8 >> 0x1f,0);
  local_98[8] = false;
  uStack_8f = 0;
  uStack_89 = 0;
  sStack_88.pi_._0_7_ = 0;
  sStack_88.pi_._7_1_ = 0;
  TmpS.super_base_blob<160U>.m_data._M_elems[0] = 'p';
  TmpS.super_base_blob<160U>.m_data._M_elems[1] = 'f';
  TmpS.super_base_blob<160U>.m_data._M_elems[2] = 0xf9;
  TmpS.super_base_blob<160U>.m_data._M_elems[3] = '\0';
  TmpS.super_base_blob<160U>.m_data._M_elems[4] = '\0';
  TmpS.super_base_blob<160U>.m_data._M_elems[5] = '\0';
  TmpS.super_base_blob<160U>.m_data._M_elems[6] = '\0';
  TmpS.super_base_blob<160U>.m_data._M_elems[7] = '\0';
  TmpS.super_base_blob<160U>.m_data._M_elems[8] = 0xcf;
  TmpS.super_base_blob<160U>.m_data._M_elems[9] = 'f';
  TmpS.super_base_blob<160U>.m_data._M_elems[10] = 0xf9;
  TmpS.super_base_blob<160U>.m_data._M_elems[0xb] = '\0';
  TmpS.super_base_blob<160U>.m_data._M_elems[0xc] = '\0';
  TmpS.super_base_blob<160U>.m_data._M_elems[0xd] = '\0';
  TmpS.super_base_blob<160U>.m_data._M_elems[0xe] = '\0';
  TmpS.super_base_blob<160U>.m_data._M_elems[0xf] = '\0';
  local_f0._0_8_ = &R2L;
  local_118 = '\0';
  local_120 = &PTR__lazy_ostream_013d4988;
  local_110 = boost::unit_test::lazy_ostream::inst;
  local_108 = (uint160 *)&local_f0;
  local_100.pi_ = (sp_counted_base *)&R1L;
  local_140 = 0;
  local_148 = &PTR__lazy_ostream_013d4988;
  local_138 = boost::unit_test::lazy_ostream::inst;
  pvVar9 = (iterator)0x1;
  pvVar10 = (iterator)0x4;
  local_130 = (uint160 *)&local_100;
  boost::test_tools::tt_detail::report_assertion
            ((assertion_result *)local_98,(lazy_ostream *)&TmpL,1,4,REQUIRE,0xe8619f,(size_t)&TmpS,
             0xa0,&local_120,"R1L",&local_148);
  boost::detail::shared_count::~shared_count(&sStack_88);
  local_340 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/uint256_tests.cpp";
  local_338 = "";
  local_350 = &boost::unit_test::basic_cstring<char_const>::null;
  local_348 = &boost::unit_test::basic_cstring<char_const>::null;
  file_14.m_end = (iterator)0xa2;
  file_14.m_begin = (iterator)&local_340;
  msg_14.m_end = pvVar10;
  msg_14.m_begin = pvVar9;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_14,(size_t)&local_350,
             msg_14);
  TmpL.super_base_blob<256U>.m_data._M_elems._8_8_ =
       TmpL.super_base_blob<256U>.m_data._M_elems._8_8_ & 0xffffffffffffff00;
  TmpL.super_base_blob<256U>.m_data._M_elems._0_8_ = &PTR__lazy_ostream_013d3cb0;
  local_98[0] = (class_property<bool>)(R2L < R1L);
  TmpL.super_base_blob<256U>.m_data._M_elems._16_8_ = boost::unit_test::lazy_ostream::inst;
  TmpL.super_base_blob<256U>.m_data._M_elems._24_8_ = (long)"\x05\x04\x03\x02\x01" + 5;
  local_98[8] = false;
  uStack_8f = 0;
  uStack_89 = 0;
  sStack_88.pi_._0_7_ = 0;
  sStack_88.pi_._7_1_ = 0;
  TmpS.super_base_blob<160U>.m_data._M_elems[0] = 'p';
  TmpS.super_base_blob<160U>.m_data._M_elems[1] = 'f';
  TmpS.super_base_blob<160U>.m_data._M_elems[2] = 0xf9;
  TmpS.super_base_blob<160U>.m_data._M_elems[3] = '\0';
  TmpS.super_base_blob<160U>.m_data._M_elems[4] = '\0';
  TmpS.super_base_blob<160U>.m_data._M_elems[5] = '\0';
  TmpS.super_base_blob<160U>.m_data._M_elems[6] = '\0';
  TmpS.super_base_blob<160U>.m_data._M_elems[7] = '\0';
  TmpS.super_base_blob<160U>.m_data._M_elems[8] = 0xcf;
  TmpS.super_base_blob<160U>.m_data._M_elems[9] = 'f';
  TmpS.super_base_blob<160U>.m_data._M_elems[10] = 0xf9;
  TmpS.super_base_blob<160U>.m_data._M_elems[0xb] = '\0';
  TmpS.super_base_blob<160U>.m_data._M_elems[0xc] = '\0';
  TmpS.super_base_blob<160U>.m_data._M_elems[0xd] = '\0';
  TmpS.super_base_blob<160U>.m_data._M_elems[0xe] = '\0';
  TmpS.super_base_blob<160U>.m_data._M_elems[0xf] = '\0';
  local_f0._0_8_ = &R2L;
  local_118 = '\0';
  local_120 = &PTR__lazy_ostream_013d4aa0;
  local_110 = boost::unit_test::lazy_ostream::inst;
  local_108 = (uint160 *)&local_f0;
  local_100.pi_ = (sp_counted_base *)&R1L;
  local_140 = 0;
  local_148 = &PTR__lazy_ostream_013d4aa0;
  local_138 = boost::unit_test::lazy_ostream::inst;
  pvVar9 = (iterator)0x1;
  pvVar10 = (iterator)0x4;
  local_130 = (uint160 *)&local_100;
  boost::test_tools::tt_detail::report_assertion
            ((assertion_result *)local_98,(lazy_ostream *)&TmpL,1,4,REQUIRE,0xf96b82,(size_t)&TmpS,
             0xa2,&local_120,"*R1L.begin()",&local_148);
  boost::detail::shared_count::~shared_count(&sStack_88);
  local_360 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/uint256_tests.cpp";
  local_358 = "";
  local_370 = &boost::unit_test::basic_cstring<char_const>::null;
  local_368 = &boost::unit_test::basic_cstring<char_const>::null;
  file_15.m_end = (iterator)0xa4;
  file_15.m_begin = (iterator)&local_360;
  msg_15.m_end = pvVar10;
  msg_15.m_begin = pvVar9;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_15,(size_t)&local_370,
             msg_15);
  TmpL.super_base_blob<256U>.m_data._M_elems._8_8_ =
       TmpL.super_base_blob<256U>.m_data._M_elems._8_8_ & 0xffffffffffffff00;
  TmpL.super_base_blob<256U>.m_data._M_elems._0_8_ = &PTR__lazy_ostream_013d3cb0;
  TmpL.super_base_blob<256U>.m_data._M_elems._16_8_ = boost::unit_test::lazy_ostream::inst;
  TmpL.super_base_blob<256U>.m_data._M_elems._24_8_ = (long)"\x05\x04\x03\x02\x01" + 5;
  local_98[0] = (class_property<bool>)(class_property<bool>)(DAT_013ed470 < DAT_013ed4a4);
  local_98[8] = false;
  uStack_8f = 0;
  uStack_89 = 0;
  sStack_88.pi_._0_7_ = 0;
  sStack_88.pi_._7_1_ = 0;
  TmpS.super_base_blob<160U>.m_data._M_elems[0] = 'p';
  TmpS.super_base_blob<160U>.m_data._M_elems[1] = 'f';
  TmpS.super_base_blob<160U>.m_data._M_elems[2] = 0xf9;
  TmpS.super_base_blob<160U>.m_data._M_elems[3] = '\0';
  TmpS.super_base_blob<160U>.m_data._M_elems[4] = '\0';
  TmpS.super_base_blob<160U>.m_data._M_elems[5] = '\0';
  TmpS.super_base_blob<160U>.m_data._M_elems[6] = '\0';
  TmpS.super_base_blob<160U>.m_data._M_elems[7] = '\0';
  TmpS.super_base_blob<160U>.m_data._M_elems[8] = 0xcf;
  TmpS.super_base_blob<160U>.m_data._M_elems[9] = 'f';
  TmpS.super_base_blob<160U>.m_data._M_elems[10] = 0xf9;
  TmpS.super_base_blob<160U>.m_data._M_elems[0xb] = '\0';
  TmpS.super_base_blob<160U>.m_data._M_elems[0xc] = '\0';
  TmpS.super_base_blob<160U>.m_data._M_elems[0xd] = '\0';
  TmpS.super_base_blob<160U>.m_data._M_elems[0xe] = '\0';
  TmpS.super_base_blob<160U>.m_data._M_elems[0xf] = '\0';
  local_f0._0_8_ = &DAT_013ed470;
  local_118 = '\0';
  local_120 = &PTR__lazy_ostream_013d4aa0;
  local_110 = boost::unit_test::lazy_ostream::inst;
  local_108 = (uint160 *)&local_f0;
  local_100.pi_ = (sp_counted_base *)&DAT_013ed4a4;
  local_140 = 0;
  local_148 = &PTR__lazy_ostream_013d4aa0;
  local_138 = boost::unit_test::lazy_ostream::inst;
  pvVar9 = (iterator)0x1;
  pvVar10 = (iterator)0x4;
  local_130 = (uint160 *)&local_100;
  boost::test_tools::tt_detail::report_assertion
            ((assertion_result *)local_98,(lazy_ostream *)&TmpL,1,4,REQUIRE,0xf96b9c,(size_t)&TmpS,
             0xa4,&local_120,"*(R2L.end()-1)",&local_148);
  boost::detail::shared_count::~shared_count(&sStack_88);
  local_380 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/uint256_tests.cpp";
  local_378 = "";
  local_390 = &boost::unit_test::basic_cstring<char_const>::null;
  local_388 = &boost::unit_test::basic_cstring<char_const>::null;
  file_16.m_end = (iterator)0xa7;
  file_16.m_begin = (iterator)&local_380;
  msg_16.m_end = pvVar10;
  msg_16.m_begin = pvVar9;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_16,(size_t)&local_390,
             msg_16);
  TmpL.super_base_blob<256U>.m_data._M_elems._8_8_ =
       TmpL.super_base_blob<256U>.m_data._M_elems._8_8_ & 0xffffffffffffff00;
  TmpL.super_base_blob<256U>.m_data._M_elems._0_8_ = &PTR__lazy_ostream_013d3cb0;
  TmpL.super_base_blob<256U>.m_data._M_elems._16_8_ = boost::unit_test::lazy_ostream::inst;
  TmpL.super_base_blob<256U>.m_data._M_elems._24_8_ = (long)"\x05\x04\x03\x02\x01" + 5;
  sStack_88.pi_._0_7_ = 0;
  sStack_88.pi_._7_1_ = 0;
  local_80 = 0;
  local_98._0_8_ = (_func_int **)0x0;
  local_98[8] = false;
  uStack_8f = 0;
  uStack_89 = 0;
  uStack_79 = 0x10;
  TmpS.super_base_blob<160U>.m_data._M_elems[0] = '\x01';
  TmpS.super_base_blob<160U>.m_data._M_elems[1] = '\0';
  TmpS.super_base_blob<160U>.m_data._M_elems[2] = '\0';
  TmpS.super_base_blob<160U>.m_data._M_elems[3] = '\0';
  TmpS.super_base_blob<160U>.m_data._M_elems[4] = '\0';
  TmpS.super_base_blob<160U>.m_data._M_elems[5] = '\0';
  TmpS.super_base_blob<160U>.m_data._M_elems[6] = '\0';
  TmpS.super_base_blob<160U>.m_data._M_elems[7] = '\0';
  TmpS.super_base_blob<160U>.m_data._M_elems[8] = '\0';
  TmpS.super_base_blob<160U>.m_data._M_elems[9] = '\0';
  TmpS.super_base_blob<160U>.m_data._M_elems[10] = '\0';
  TmpS.super_base_blob<160U>.m_data._M_elems[0xb] = '\0';
  TmpS.super_base_blob<160U>.m_data._M_elems[0xc] = '\0';
  TmpS.super_base_blob<160U>.m_data._M_elems[0xd] = '\0';
  TmpS.super_base_blob<160U>.m_data._M_elems[0xe] = '\0';
  TmpS.super_base_blob<160U>.m_data._M_elems[0xf] = '\0';
  TmpS.super_base_blob<160U>.m_data._M_elems[0x10] = '\0';
  TmpS.super_base_blob<160U>.m_data._M_elems[0x11] = '\0';
  TmpS.super_base_blob<160U>.m_data._M_elems[0x12] = '\0';
  TmpS.super_base_blob<160U>.m_data._M_elems[0x13] = '\0';
  iVar8 = memcmp(local_98,&TmpS,0x20);
  local_f0.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
       (readonly_property<bool>)(readonly_property<bool>)(byte)((uint)iVar8 >> 0x1f);
  local_f0.m_message.px = (element_type *)0x0;
  local_f0.m_message.pn.pi_ = (sp_counted_base *)0x0;
  local_100.pi_ = (sp_counted_base *)0xf96670;
  local_f8 = "";
  local_118 = '\0';
  local_120 = &PTR__lazy_ostream_013d4988;
  local_110 = boost::unit_test::lazy_ostream::inst;
  local_108 = (uint160 *)local_128;
  local_130 = (uint160 *)&local_150;
  local_140 = 0;
  local_148 = &PTR__lazy_ostream_013d4988;
  local_138 = boost::unit_test::lazy_ostream::inst;
  local_150 = &TmpS;
  local_128 = (undefined1  [8])local_98;
  boost::test_tools::tt_detail::report_assertion
            (&local_f0,(lazy_ostream *)&TmpL,1,4,REQUIRE,0xf96bba,(size_t)&local_100,0xa7,&local_120
             ,"uint256{\"0000000000000000000000000000000000000000000000000000000000000001\"}",
             &local_148);
  boost::detail::shared_count::~shared_count(&local_f0.m_message.pn);
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar2) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

BOOST_AUTO_TEST_CASE( comparison ) // <= >= < >
{
    uint256 LastL;
    for (int i = 255; i >= 0; --i) {
        uint256 TmpL;
        *(TmpL.begin() + (i>>3)) |= 1<<(7-(i&7));
        BOOST_CHECK_LT(LastL, TmpL);
        LastL = TmpL;
    }

    BOOST_CHECK_LT(ZeroL, R1L);
    BOOST_CHECK_LT(R2L, R1L);
    BOOST_CHECK_LT(ZeroL, OneL);
    BOOST_CHECK_LT(OneL, MaxL);
    BOOST_CHECK_LT(R1L, MaxL);
    BOOST_CHECK_LT(R2L, MaxL);

    uint160 LastS;
    for (int i = 159; i >= 0; --i) {
        uint160 TmpS;
        *(TmpS.begin() + (i>>3)) |= 1<<(7-(i&7));
        BOOST_CHECK_LT(LastS, TmpS);
        LastS = TmpS;
    }
    BOOST_CHECK_LT(ZeroS, R1S);
    BOOST_CHECK_LT(R2S, R1S);
    BOOST_CHECK_LT(ZeroS, OneS);
    BOOST_CHECK_LT(OneS, MaxS);
    BOOST_CHECK_LT(R1S, MaxS);
    BOOST_CHECK_LT(R2S, MaxS);

    // Non-arithmetic uint256s compare from the beginning of their inner arrays:
    BOOST_CHECK_LT(R2L, R1L);
    // Ensure first element comparisons give the same order as above:
    BOOST_CHECK_LT(*R2L.begin(), *R1L.begin());
    // Ensure last element comparisons give a different result (swapped params):
    BOOST_CHECK_LT(*(R1L.end()-1), *(R2L.end()-1));
    // Hex strings represent reverse-encoded bytes, with lexicographic ordering:
    BOOST_CHECK_LT(uint256{"1000000000000000000000000000000000000000000000000000000000000000"},
                   uint256{"0000000000000000000000000000000000000000000000000000000000000001"});
}